

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::prepend(QByteArray *this,QByteArray *ba)

{
  long lVar1;
  QByteArrayView a;
  bool bVar2;
  qsizetype qVar3;
  QArrayDataPointer<char> *this_00;
  QArrayDataPointer<char> *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  QByteArray *pQVar4;
  QByteArray *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size(in_RDI);
  if (qVar3 == 0) {
    this_00 = (QArrayDataPointer<char> *)size((QByteArray *)in_RSI);
    qVar3 = QArrayDataPointer<char>::constAllocatedCapacity(this_00);
    if ((qVar3 < (long)this_00) && (bVar2 = QArrayDataPointer<char>::isMutable(in_RSI), bVar2)) {
      local_20 = operator=((QByteArray *)this_00,in_stack_ffffffffffffffb8);
      goto LAB_001c0669;
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>((QByteArrayView *)in_RSI,in_RDI);
  a.m_data = (storage_type *)pQVar4;
  a.m_size = (qsizetype)in_RSI;
  local_20 = prepend(in_stack_ffffffffffffffb8,a);
LAB_001c0669:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

QByteArray &QByteArray::prepend(const QByteArray &ba)
{
    if (size() == 0 && ba.size() > d.constAllocatedCapacity() && ba.d.isMutable())
        return (*this = ba);
    return prepend(QByteArrayView(ba));
}